

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O1

google_protobuf_FileDescriptorProto *
upb_ToProto_ConvertFileDef(upb_ToProto_Context *ctx,upb_FileDef *f)

{
  upb_Arena *puVar1;
  _Bool _Var2;
  int iVar3;
  upb_Syntax uVar4;
  google_protobuf_Edition gVar5;
  upb_DecodeStatus uVar6;
  char *pcVar7;
  size_t sVar8;
  void *pvVar9;
  upb_FileDef *f_00;
  int32_t *piVar10;
  upb_MessageDef *m;
  google_protobuf_DescriptorProto *pgVar11;
  upb_EnumDef *e;
  google_protobuf_EnumDescriptorProto *pgVar12;
  upb_ServiceDef *s;
  google_protobuf_ServiceDescriptorProto *pgVar13;
  upb_FieldDef *f_01;
  google_protobuf_FieldDescriptorProto *pgVar14;
  google_protobuf_FileOptions *msg;
  google_protobuf_FileDescriptorProto *msg_00;
  anon_union_8_2_9eb4e620_for_upb_Message_0 msg_01;
  size_t sVar15;
  __jmp_buf_tag *__env;
  size_t *psVar16;
  upb_StringView str;
  upb_StringView str_00;
  upb_StringView str_01;
  upb_StringView uVar17;
  upb_MiniTableField field;
  char *local_50;
  undefined4 local_48;
  __jmp_buf_tag *local_40;
  size_t local_38;
  
  __env = (__jmp_buf_tag *)ctx->err;
  iVar3 = _setjmp(__env);
  if (iVar3 != 0) {
    return (google_protobuf_FileDescriptorProto *)0x0;
  }
  puVar1 = ctx->arena;
  msg_00 = (google_protobuf_FileDescriptorProto *)puVar1->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)msg_00) < 0x88) {
    msg_00 = (google_protobuf_FileDescriptorProto *)
             _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,0x88);
  }
  else {
    if ((google_protobuf_FileDescriptorProto *)
        ((ulong)((long)&(msg_00->base_dont_copy_me__upb_internal_use_only).field_0 + 7U) &
        0xfffffffffffffff8) != msg_00) goto LAB_00119ef9;
    puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg_00 + 0x11);
  }
  if (msg_00 == (google_protobuf_FileDescriptorProto *)0x0) {
    msg_00 = (google_protobuf_FileDescriptorProto *)0x0;
  }
  else {
    memset(msg_00,0,0x88);
  }
  if (msg_00 == (google_protobuf_FileDescriptorProto *)0x0) goto LAB_00119f22;
  pcVar7 = upb_FileDef_Name(f);
  sVar8 = strlen(pcVar7);
  uVar17.size = sVar8;
  uVar17.data = pcVar7;
  uVar17 = strviewdup2(ctx,uVar17);
  if (((ulong)(msg_00->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0)
  goto LAB_00119eda;
  *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 =
       *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 | 1;
  *(upb_StringView *)(msg_00 + 2) = uVar17;
  pcVar7 = upb_FileDef_Package(f);
  if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
    sVar8 = strlen(pcVar7);
    str.size = sVar8;
    str.data = pcVar7;
    uVar17 = strviewdup2(ctx,str);
    if (((ulong)(msg_00->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0)
    goto LAB_00119eda;
    *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 =
         *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 | 2;
    *(upb_StringView *)(msg_00 + 4) = uVar17;
  }
  uVar4 = upb_FileDef_Syntax(f);
  if (uVar4 == kUpb_Syntax_Editions) {
    gVar5 = upb_FileDef_Edition(f);
    if (((ulong)(msg_00->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0)
    goto LAB_00119eda;
    *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 =
         *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 | 0x20;
    *(google_protobuf_Edition *)
     ((long)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 + 4) = gVar5;
  }
  uVar4 = upb_FileDef_Syntax(f);
  if (uVar4 == kUpb_Syntax_Proto3) {
    pcVar7 = "proto3";
    sVar15 = 6;
LAB_00119aac:
    str_00.size = sVar15;
    str_00.data = pcVar7;
    uVar17 = strviewdup2(ctx,str_00);
    if (((ulong)(msg_00->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0)
    goto LAB_00119eda;
    *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 =
         *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 | 0x10;
    *(upb_StringView *)(msg_00 + 0xf) = uVar17;
  }
  else {
    uVar4 = upb_FileDef_Syntax(f);
    if (uVar4 == kUpb_Syntax_Editions) {
      pcVar7 = "editions";
      sVar15 = 8;
      goto LAB_00119aac;
    }
  }
  local_40 = __env;
  iVar3 = upb_FileDef_DependencyCount(f);
  local_50 = (char *)0x3000000003;
  local_48._0_2_ = 0xffff;
  local_48._2_1_ = '\f';
  local_48._3_1_ = 0xd1;
  pvVar9 = upb_Message_ResizeArrayUninitialized
                     (&msg_00->base_dont_copy_me__upb_internal_use_only,
                      (upb_MiniTableField *)&local_50,(long)iVar3,ctx->arena);
  if (iVar3 != 0) {
    psVar16 = (size_t *)((long)pvVar9 + 8);
    sVar15 = 0;
    do {
      f_00 = upb_FileDef_Dependency(f,(int)sVar15);
      pcVar7 = upb_FileDef_Name(f_00);
      sVar8 = strlen(pcVar7);
      str_01.size = sVar8;
      str_01.data = pcVar7;
      uVar17 = strviewdup2(ctx,str_01);
      psVar16[-1] = (size_t)uVar17.data;
      *psVar16 = uVar17.size;
      sVar15 = sVar15 + 1;
      psVar16 = psVar16 + 2;
    } while ((long)iVar3 != sVar15);
  }
  iVar3 = upb_FileDef_PublicDependencyCount(f);
  local_50 = (char *)0x680000000a;
  local_48._0_2_ = 0xffff;
  local_48._2_1_ = '\x05';
  local_48._3_1_ = 0xc1;
  pvVar9 = upb_Message_ResizeArrayUninitialized
                     (&msg_00->base_dont_copy_me__upb_internal_use_only,
                      (upb_MiniTableField *)&local_50,(long)iVar3,ctx->arena);
  piVar10 = _upb_FileDef_PublicDependencyIndexes(f);
  if (iVar3 != 0) {
    memcpy(pvVar9,piVar10,(long)iVar3 << 2);
  }
  iVar3 = upb_FileDef_WeakDependencyCount(f);
  local_50 = (char *)0x700000000b;
  local_48._0_2_ = 0xffff;
  local_48._2_1_ = '\x05';
  local_48._3_1_ = 0xc1;
  pvVar9 = upb_Message_ResizeArrayUninitialized
                     (&msg_00->base_dont_copy_me__upb_internal_use_only,
                      (upb_MiniTableField *)&local_50,(long)iVar3,ctx->arena);
  piVar10 = _upb_FileDef_WeakDependencyIndexes(f);
  if (iVar3 != 0) {
    memcpy(pvVar9,piVar10,(long)iVar3 << 2);
  }
  iVar3 = upb_FileDef_TopLevelMessageCount(f);
  local_50 = (char *)0x3800000004;
  local_48._0_2_ = 0;
  local_48._2_1_ = '\v';
  local_48._3_1_ = 0xc1;
  pvVar9 = upb_Message_ResizeArrayUninitialized
                     (&msg_00->base_dont_copy_me__upb_internal_use_only,
                      (upb_MiniTableField *)&local_50,(long)iVar3,ctx->arena);
  if (iVar3 != 0) {
    sVar15 = 0;
    do {
      m = upb_FileDef_TopLevelMessage(f,(int)sVar15);
      pgVar11 = msgdef_toproto(ctx,m);
      *(google_protobuf_DescriptorProto **)((long)pvVar9 + sVar15 * 8) = pgVar11;
      sVar15 = sVar15 + 1;
    } while ((long)iVar3 != sVar15);
  }
  iVar3 = upb_FileDef_TopLevelEnumCount(f);
  local_50 = (char *)0x4000000005;
  local_48._0_2_ = 1;
  local_48._2_1_ = '\v';
  local_48._3_1_ = 0xc1;
  pvVar9 = upb_Message_ResizeArrayUninitialized
                     (&msg_00->base_dont_copy_me__upb_internal_use_only,
                      (upb_MiniTableField *)&local_50,(long)iVar3,ctx->arena);
  if (iVar3 != 0) {
    sVar15 = 0;
    do {
      e = upb_FileDef_TopLevelEnum(f,(int)sVar15);
      pgVar12 = enumdef_toproto(ctx,e);
      *(google_protobuf_EnumDescriptorProto **)((long)pvVar9 + sVar15 * 8) = pgVar12;
      sVar15 = sVar15 + 1;
    } while ((long)iVar3 != sVar15);
  }
  iVar3 = upb_FileDef_ServiceCount(f);
  local_50 = (char *)0x4800000006;
  local_48._0_2_ = 2;
  local_48._2_1_ = '\v';
  local_48._3_1_ = 0xc1;
  pvVar9 = upb_Message_ResizeArrayUninitialized
                     (&msg_00->base_dont_copy_me__upb_internal_use_only,
                      (upb_MiniTableField *)&local_50,(long)iVar3,ctx->arena);
  if (iVar3 != 0) {
    sVar15 = 0;
    do {
      s = upb_FileDef_Service(f,(int)sVar15);
      pgVar13 = servicedef_toproto(ctx,s);
      *(google_protobuf_ServiceDescriptorProto **)((long)pvVar9 + sVar15 * 8) = pgVar13;
      sVar15 = sVar15 + 1;
    } while ((long)iVar3 != sVar15);
  }
  iVar3 = upb_FileDef_TopLevelExtensionCount(f);
  local_50 = (char *)0x5000000007;
  local_48._0_2_ = 3;
  local_48._2_1_ = '\v';
  local_48._3_1_ = 0xc1;
  pvVar9 = upb_Message_ResizeArrayUninitialized
                     (&msg_00->base_dont_copy_me__upb_internal_use_only,
                      (upb_MiniTableField *)&local_50,(long)iVar3,ctx->arena);
  if (iVar3 != 0) {
    sVar15 = 0;
    do {
      f_01 = upb_FileDef_TopLevelExtension(f,(int)sVar15);
      pgVar14 = fielddef_toproto(ctx,f_01);
      *(google_protobuf_FieldDescriptorProto **)((long)pvVar9 + sVar15 * 8) = pgVar14;
      sVar15 = sVar15 + 1;
    } while ((long)iVar3 != sVar15);
  }
  _Var2 = upb_FileDef_HasOptions(f);
  if (!_Var2) {
    return msg_00;
  }
  msg = upb_FileDef_Options(f);
  upb_Encode(&msg->base_dont_copy_me__upb_internal_use_only,&google__protobuf__FileOptions_msg_init,
             0,ctx->arena,&local_50,&local_38);
  pcVar7 = local_50;
  __env = local_40;
  if (local_50 != (char *)0x0) {
    puVar1 = ctx->arena;
    msg_01.internal_opaque = (uintptr_t)puVar1->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)msg_01) < 200) {
      msg_01 = (anon_union_8_2_9eb4e620_for_upb_Message_0)
               _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,200);
    }
    else {
      if ((char *)((ulong)(msg_01.internal_opaque + 7) & 0xfffffffffffffff8) !=
          (char *)msg_01.internal_opaque) {
LAB_00119ef9:
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mem/internal/arena.h"
                      ,0x3f,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg_01.internal_opaque + 200);
    }
    if ((char *)msg_01.internal_opaque == (char *)0x0) {
      msg_01.internal_opaque = 0;
    }
    else {
      memset((void *)msg_01,0,200);
    }
    if (msg_01.internal_opaque == 0) {
      msg_01.internal_opaque = 0;
    }
    else {
      uVar6 = upb_Decode(pcVar7,local_38,(upb_Message *)msg_01,
                         &google__protobuf__FileOptions_msg_init,(upb_ExtensionRegistry *)0x0,0,
                         puVar1);
      if (uVar6 != kUpb_DecodeStatus_Ok) {
        msg_01.internal_opaque = 0;
      }
    }
    __env = local_40;
    if (msg_01 != (anon_union_8_2_9eb4e620_for_upb_Message_0)0x0) {
      if (((ulong)(msg_00->base_dont_copy_me__upb_internal_use_only).field_0 & 1) == 0) {
        *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 =
             *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 | 4;
        *(anon_union_8_2_9eb4e620_for_upb_Message_0 *)(msg_00 + 0xb) = msg_01;
        return msg_00;
      }
LAB_00119eda:
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/internal/accessors.h"
                    ,0x13b,
                    "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
                   );
    }
  }
LAB_00119f22:
  longjmp(__env,1);
}

Assistant:

google_protobuf_FileDescriptorProto* upb_ToProto_ConvertFileDef(
    upb_ToProto_Context* const ctx, const upb_FileDef* const f) {
  if (UPB_SETJMP(ctx->err)) return NULL;
  return filedef_toproto(ctx, f);
}